

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.cc
# Opt level: O2

void __thiscall iqxmlrpc::Parser::parse(Parser *this,BuilderBase *builder)

{
  type pIVar1;
  ulong uVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  string *psVar3;
  string sStack_38;
  
  psVar3 = (string *)builder;
  pIVar1 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
  uVar2 = Impl::read(pIVar1,(int)psVar3,__buf,in_RCX);
  do {
    if ((uVar2 & 1) != 0) {
      return;
    }
    if (((uint)uVar2 >> 8 & 1) == 0) {
      if (((uint)uVar2 >> 0x10 & 1) != 0) {
        if (builder->depth_ == 0) {
          pIVar1 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
          pIVar1->pushed_back = true;
          return;
        }
        pIVar1 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
        Impl::tag_name_abi_cxx11_(&sStack_38,pIVar1);
        psVar3 = &sStack_38;
        BuilderBase::visit_element_end(builder,&sStack_38);
        goto LAB_00174143;
      }
      if (((uVar2 >> 0x20 & 1) != 0) && (builder->expect_text_ == true)) {
        get_data_abi_cxx11_(&sStack_38,this);
        psVar3 = &sStack_38;
        (*builder->_vptr_BuilderBase[2])(builder);
        goto LAB_00174143;
      }
    }
    else {
      pIVar1 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
      Impl::tag_name_abi_cxx11_(&sStack_38,pIVar1);
      builder->depth_ = builder->depth_ + 1;
      psVar3 = &sStack_38;
      (**builder->_vptr_BuilderBase)(builder);
LAB_00174143:
      std::__cxx11::string::~string((string *)&sStack_38);
    }
    if (builder->want_exit_ != false) {
      return;
    }
    pIVar1 = boost::shared_ptr<iqxmlrpc::Parser::Impl>::operator->(&this->impl_);
    uVar2 = Impl::read(pIVar1,(int)psVar3,__buf_00,in_RCX);
  } while( true );
}

Assistant:

void
Parser::parse(BuilderBase& builder)
{
  for (Impl::ParseStep p = impl_->read(); !p.done; p = impl_->read()) {
    if (p.element_begin) {
      builder.visit_element(impl_->tag_name());

    } else if (p.element_end) {
      if (!builder.depth()) {
        impl_->pushed_back = true;
        break;
      }

      builder.visit_element_end(impl_->tag_name());

    } else if (p.is_text && builder.expects_text()) {
      builder.visit_text(get_data());
    }

    if (builder.wants_exit())
      break;

  } // for
}